

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

void secp256k1_scalar_inverse_var(secp256k1_scalar *r,secp256k1_scalar *x)

{
  undefined1 local_40 [8];
  secp256k1_modinv64_signed62 s;
  secp256k1_scalar *x_local;
  secp256k1_scalar *r_local;
  
  s.v[4] = (int64_t)x;
  secp256k1_scalar_to_signed62((secp256k1_modinv64_signed62 *)local_40,x);
  secp256k1_modinv64_var((secp256k1_modinv64_signed62 *)local_40,&secp256k1_const_modinfo_scalar);
  secp256k1_scalar_from_signed62(r,(secp256k1_modinv64_signed62 *)local_40);
  return;
}

Assistant:

static void secp256k1_scalar_inverse_var(secp256k1_scalar *r, const secp256k1_scalar *x) {
    secp256k1_modinv64_signed62 s;
#ifdef VERIFY
    int zero_in = secp256k1_scalar_is_zero(x);
#endif
    secp256k1_scalar_to_signed62(&s, x);
    secp256k1_modinv64_var(&s, &secp256k1_const_modinfo_scalar);
    secp256k1_scalar_from_signed62(r, &s);

#ifdef VERIFY
    VERIFY_CHECK(secp256k1_scalar_is_zero(r) == zero_in);
#endif
}